

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

void __thiscall stream::slice_reader::seek(slice_reader *this,size_t slice)

{
  bool bVar1;
  slice_error *this_00;
  int in_EDX;
  int extraout_EDX;
  char *in_RSI;
  slice_reader *in_RDI;
  string *in_stack_ffffffffffffff98;
  slice_reader *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if ((in_RSI != (char *)in_RDI->current_slice) ||
     (bVar1 = is_open(in_stack_ffffffffffffffa0), in_EDX = extraout_EDX, !bVar1)) {
    if (in_RDI->data_offset != 0) {
      this_00 = (slice_error *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      slice_error::slice_error(this_00,in_stack_ffffffffffffff98);
      __cxa_throw(this_00,&slice_error::typeinfo,slice_error::~slice_error);
    }
    open(in_RDI,in_RSI,in_EDX);
  }
  return;
}

Assistant:

void slice_reader::seek(size_t slice) {
	
	if(slice == current_slice && is_open()) {
		return;
	}
	
	if(data_offset != 0) {
		throw slice_error("cannot change slices in single-file setup");
	}
	
	open(slice);
}